

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t best_effort_strncat_from_utf16
                  (archive_string *as,void *_p,size_t bytes,archive_string_conv *sc,wchar_t be)

{
  archive_string *paVar1;
  char *s;
  uint32_t *in_RSI;
  long *in_RDI;
  wchar_t ret;
  wchar_t n;
  uint32_t uc;
  char *mbs;
  char *utf16;
  uint in_stack_ffffffffffffffb0;
  wchar_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  wchar_t local_4;
  
  local_4 = L'\0';
  paVar1 = archive_string_ensure
                     ((archive_string *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      (ulong)in_stack_ffffffffffffffb0);
  if (paVar1 == (archive_string *)0x0) {
    local_4 = L'\xffffffff';
  }
  else {
    s = (char *)(*in_RDI + in_RDI[1]);
    while( true ) {
      in_stack_ffffffffffffffb8 =
           utf16_to_unicode(in_RSI,s,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            local_4);
      if (in_stack_ffffffffffffffb8 == L'\0') break;
      if (in_stack_ffffffffffffffb8 < L'\0') {
        in_stack_ffffffffffffffb8 = -in_stack_ffffffffffffffb8;
        local_4 = L'\xffffffff';
      }
      in_RSI = (uint32_t *)((long)in_RSI + (long)in_stack_ffffffffffffffb8);
      if (in_stack_ffffffffffffffbc < 0x80) {
        *s = (char)in_stack_ffffffffffffffbc;
      }
      else {
        *s = '?';
        local_4 = L'\xffffffff';
      }
      s = s + 1;
    }
    in_RDI[1] = (long)s - *in_RDI;
    *(undefined1 *)(*in_RDI + in_RDI[1]) = 0;
  }
  return local_4;
}

Assistant:

static int
best_effort_strncat_from_utf16(struct archive_string *as, const void *_p,
    size_t bytes, struct archive_string_conv *sc, int be)
{
	const char *utf16 = (const char *)_p;
	char *mbs;
	uint32_t uc;
	int n, ret;

	(void)sc; /* UNUSED */
	/*
	 * Other case, we should do the best effort.
	 * If all character are ASCII(<0x7f), we can convert it.
	 * if not , we set a alternative character and return -1.
	 */
	ret = 0;
	if (archive_string_ensure(as, as->length + bytes +1) == NULL)
		return (-1);
	mbs = as->s + as->length;

	while ((n = utf16_to_unicode(&uc, utf16, bytes, be)) != 0) {
		if (n < 0) {
			n *= -1;
			ret =  -1;
		}
		bytes -= n;
		utf16 += n;

		if (uc > 127) {
			/* We cannot handle it. */
			*mbs++ = '?';
			ret =  -1;
		} else
			*mbs++ = (char)uc;
	}
	as->length = mbs - as->s;
	as->s[as->length] = '\0';
	return (ret);
}